

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fbo.cpp
# Opt level: O0

void __thiscall
vera::Fbo::allocate(Fbo *this,uint32_t _width,uint32_t _height,FboType _type,TextureFilter _filter,
                   TextureWrap _wrap,bool _autoclear)

{
  bool bVar1;
  GLenum GVar2;
  uint uVar3;
  ostream *this_00;
  void *this_01;
  GLenum result;
  GLenum depth_type;
  GLenum depth_format;
  allocator local_51;
  string local_50;
  undefined4 local_30;
  undefined4 local_2c;
  GLenum type;
  GLenum format;
  bool depth_texture;
  bool color_texture;
  TextureFilter TStack_20;
  bool _autoclear_local;
  TextureWrap _wrap_local;
  TextureFilter _filter_local;
  FboType _type_local;
  uint32_t _height_local;
  uint32_t _width_local;
  Fbo *this_local;
  
  type._3_1_ = _autoclear;
  type._2_1_ = 1;
  type._1_1_ = 0;
  this->m_autoclear = _autoclear;
  format = _wrap;
  TStack_20 = _filter;
  switch(_type) {
  case COLOR_TEXTURE:
  case COLOR_FLOAT_TEXTURE:
    this->m_depth = false;
    type._2_1_ = 1;
    type._1_1_ = 0;
    break;
  case COLOR_DEPTH_TEXTURES:
    this->m_depth = true;
    type._2_1_ = 1;
    type._1_1_ = 1;
    break;
  case GBUFFER_TEXTURE:
    TStack_20 = NEAREST;
    format = 1;
  case COLOR_TEXTURE_DEPTH_BUFFER:
    this->m_depth = true;
    type._2_1_ = 1;
    type._1_1_ = 0;
    break;
  case DEPTH_TEXTURE:
    this->m_depth = true;
    type._2_1_ = 0;
    type._1_1_ = 1;
  }
  _wrap_local = _type;
  _filter_local = _height;
  _type_local = _width;
  __height_local = this;
  if ((this->m_allocated & 1U) == 0) {
    glGenFramebuffers(1,&this->m_fbo_id);
    if ((this->m_depth & 1U) != 0) {
      glGenRenderbuffers(1,&this->m_depth_buffer);
    }
  }
  else if (((this->m_width == _width) && (this->m_height == _height)) && (this->m_type == _type)) {
    return;
  }
  this->m_type = _wrap_local;
  this->m_width = _type_local;
  this->m_height = _filter_local;
  (*this->_vptr_Fbo[3])();
  if ((type._2_1_ & 1) != 0) {
    if (this->m_id == 0) {
      glGenTextures(1,&this->m_id);
    }
    glBindTexture(0xde1,this->m_id);
    local_2c = 0x1908;
    local_30 = 0x1401;
    if ((_wrap_local == 2) || (_wrap_local == 4)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_50,"OES_texture_float",&local_51);
      bVar1 = haveExtension(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      if (bVar1) {
        local_2c = 0x8814;
        local_30 = 0x1406;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&depth_format,"OES_texture_half_float",
                   (allocator *)((long)&depth_type + 3));
        bVar1 = haveExtension((string *)&depth_format);
        std::__cxx11::string::~string((string *)&depth_format);
        std::allocator<char>::~allocator((allocator<char> *)((long)&depth_type + 3));
        if (bVar1) {
          local_2c = 0x881a;
          local_30 = 0x1406;
        }
        else {
          local_2c = 0x805b;
          local_30 = 0x1401;
        }
      }
    }
    glTexImage2D(0xde1,0,local_2c,this->m_width,this->m_height,0,0x1908,local_30,0);
    GVar2 = getWrap(format);
    glTexParameteri(0xde1,0x2802,GVar2);
    GVar2 = getWrap(format);
    glTexParameteri(0xde1,0x2803,GVar2);
    GVar2 = getMinificationFilter(TStack_20);
    glTexParameteri(0xde1,0x2801,GVar2);
    GVar2 = getMagnificationFilter(TStack_20);
    glTexParameteri(0xde1,0x2800,GVar2);
    glFramebufferTexture2D(0x8d40,0x8ce0,0xde1,this->m_id,0);
  }
  if ((this->m_depth & 1U) != 0) {
    glBindRenderbuffer(0x8d41,this->m_depth_buffer);
    glRenderbufferStorage(0x8d41,0x8cac,this->m_width,this->m_height);
    glFramebufferRenderbuffer(0x8d40,0x8d00,0x8d41,this->m_depth_buffer);
    if ((type._1_1_ & 1) != 0) {
      if (this->m_depth_id == 0) {
        glGenTextures(1,&this->m_depth_id);
      }
      glBindTexture(0xde1,this->m_depth_id);
      glTexImage2D(0xde1,0,0x8cac,this->m_width,this->m_height,0,0x1902,0x1405,0);
      glTexParameteri(0xde1,0x2800,0x2601);
      glTexParameteri(0xde1,0x2801,0x2601);
      glTexParameteri(0xde1,0x2802,0x812f);
      glTexParameteri(0xde1,0x2803,0x812f);
      glFramebufferTexture2D(0x8d40,0x8d00,0xde1,this->m_depth_id,0);
    }
  }
  uVar3 = glCheckFramebufferStatus(0x8d40);
  if (uVar3 == 0x8cd5) {
    this->m_allocated = true;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,"FBO: not complete ");
    this_01 = (void *)std::ostream::operator<<(this_00,uVar3);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  (*this->_vptr_Fbo[4])();
  if ((this->m_depth & 1U) != 0) {
    glBindRenderbuffer(0x8d41,0);
  }
  return;
}

Assistant:

void Fbo::allocate(const uint32_t _width, const uint32_t _height, FboType _type, TextureFilter _filter, TextureWrap _wrap, bool _autoclear) {
    bool color_texture = true;
    bool depth_texture = false;
    
    m_autoclear = _autoclear;
    
    switch(_type) {
        case COLOR_TEXTURE:
        case COLOR_FLOAT_TEXTURE:
            m_depth = false;
            color_texture = true;
            depth_texture = false;
        break;
        case GBUFFER_TEXTURE:
            _filter = NEAREST;
            _wrap = CLAMP;
        case COLOR_TEXTURE_DEPTH_BUFFER:
            m_depth = true;
            color_texture = true;
            depth_texture = false;
        break;
        case COLOR_DEPTH_TEXTURES:
            m_depth = true;
            color_texture = true;
            depth_texture = true;
        break;
        case DEPTH_TEXTURE:
            m_depth = true;
            color_texture = false;
            depth_texture = true;
        break;
    }

    if (!m_allocated) {
        // Create a frame buffer

        glGenFramebuffers(1, &m_fbo_id);

        // Create a texture to hold the depth buffer
        if (m_depth) 
            glGenRenderbuffers(1, &m_depth_buffer);
    }
    // If it's already declare skip
    else if (m_width == _width && m_height == _height && m_type == _type)
        return;

    m_type = _type;
    m_width = _width;
    m_height = _height;

    #if defined(__EMSCRIPTEN__)
    if ( getWebGLVersionNumber() == 1 ) {
        m_width = glm::ceilPowerOfTwo( glm::max(m_width, m_height) );
        m_height = m_width;
    } 
    #endif

    bind();
    
    if (color_texture) {

        // Generate a texture to hold the colour buffer
        if (m_id == 0) 
            glGenTextures(1, &m_id);

        // Color
        glBindTexture(GL_TEXTURE_2D, m_id);

        GLenum format = GL_RGBA;
        GLenum type = GL_UNSIGNED_BYTE;

#if defined(PLATFORM_RPI) || defined(DRIVER_GBM)
#else
        if (_type == COLOR_FLOAT_TEXTURE || 
            _type == GBUFFER_TEXTURE) {
            if ( haveExtension("OES_texture_float") ) {
                format = GL_RGBA32F;
                type = GL_FLOAT;
            }
            else if ( haveExtension("OES_texture_half_float") ) {
                format = GL_RGBA16F;
                type = GL_FLOAT;
            }
            else {
                format = GL_RGBA16;
                type = GL_UNSIGNED_BYTE;
            }
        }
#endif

        glTexImage2D(GL_TEXTURE_2D, 0, format, m_width, m_height, 0, GL_RGBA, type, NULL);

        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, getWrap(_wrap));
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, getWrap(_wrap));
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, getMinificationFilter(_filter));
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, getMagnificationFilter(_filter));
        glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_id, 0);
    }

    // Depth Buffer
    if (m_depth) {
        glBindRenderbuffer(GL_RENDERBUFFER, m_depth_buffer);

        GLenum depth_format = GL_DEPTH_COMPONENT;
        GLenum depth_type = GL_UNSIGNED_SHORT;

#if defined(PLATFORM_RPI) || defined(DRIVER_GBM)
        depth_format = GL_DEPTH_COMPONENT16;

    #if GL_OES_depth32
        if ( haveExtension("GL_OES_depth32") )
            depth_format = GL_DEPTH_COMPONENT32_OES;
    #elif GL_OES_depth24
        if ( haveExtension("GL_OES_depth24") )
            depth_format = GL_DEPTH_COMPONENT24_OES;
    #endif

#elif defined(__EMSCRIPTEN__)
        depth_format = (getWebGLVersionNumber() == 1)? GL_DEPTH_COMPONENT : GL_DEPTH_COMPONENT16;

#else 
        depth_format = GL_DEPTH_COMPONENT32F;
        depth_type = GL_UNSIGNED_INT;

#endif
        glRenderbufferStorage(GL_RENDERBUFFER, depth_format, m_width, m_height);
        glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, m_depth_buffer);
    
        if (depth_texture) {

            // Generate a texture to hold the depth buffer
            if (m_depth_id == 0)
                glGenTextures(1, &m_depth_id);

            glBindTexture(GL_TEXTURE_2D, m_depth_id);
            glTexImage2D(GL_TEXTURE_2D, 0, depth_format, m_width, m_height, 0, GL_DEPTH_COMPONENT, depth_type, 0);

            #if defined(__EMSCRIPTEN__)
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
            #else
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
            #endif
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

            glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, m_depth_id, 0);
        }
    }

    // CHECK
    GLenum result = glCheckFramebufferStatus(GL_FRAMEBUFFER);
    if (result == GL_FRAMEBUFFER_COMPLETE) m_allocated = true;
    else std::cout << "FBO: not complete " << result << std::endl;
    
    unbind();

    if (m_depth)
        glBindRenderbuffer(GL_RENDERBUFFER, 0);
}